

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O1

HighsStatus __thiscall Highs::setOptionValue(Highs *this,string *option,double value)

{
  OptionStatus OVar1;
  HighsStatus HVar2;
  
  OVar1 = setLocalOptionValue(&(this->options_).super_HighsOptionsStruct.log_options,option,
                              &(this->options_).records,value);
  if (OVar1 != kOk) {
    return kError;
  }
  HVar2 = optionChangeAction(this);
  return HVar2;
}

Assistant:

HighsStatus Highs::setOptionValue(const std::string& option,
                                  const double value) {
  if (setLocalOptionValue(options_.log_options, option, options_.records,
                          value) == OptionStatus::kOk)
    return optionChangeAction();
  return HighsStatus::kError;
}